

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

void __thiscall kwssys::RegularExpression::RegularExpression(RegularExpression *this,char *s)

{
  RegularExpressionMatch *in_RSI;
  long in_RDI;
  char *in_stack_00000030;
  RegularExpression *in_stack_00000038;
  
  RegularExpressionMatch::RegularExpressionMatch(in_RSI);
  *(undefined1 *)(in_RDI + 0x208) = 0;
  *(undefined1 *)(in_RDI + 0x209) = 0;
  *(undefined8 *)(in_RDI + 0x210) = 0;
  *(undefined8 *)(in_RDI + 0x220) = 0;
  *(undefined4 *)(in_RDI + 0x228) = 0;
  if (in_RSI != (RegularExpressionMatch *)0x0) {
    compile(in_stack_00000038,in_stack_00000030);
  }
  return;
}

Assistant:

inline RegularExpression::RegularExpression(const char* s)
  : regstart{}
  , reganch{}
  , regmust{}
  , program{ nullptr }
  , progsize{}
{
  if (s) {
    this->compile(s);
  }
}